

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall
QtPrivate::QWellArray::paintCell(QWellArray *this,QPainter *p,int row,int col,QRect *rect)

{
  bool bVar1;
  int iVar2;
  QPalette *pQVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QStyleOptionFocusRect opt;
  undefined1 local_88 [16];
  undefined1 local_78 [12];
  Representation RStack_6c;
  undefined1 *local_68;
  undefined1 auStack_60 [16];
  QObject *pQStack_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidget::palette(&this->super_QWidget);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_88);
  QStyleOption::initFrom((QStyleOption *)local_88,&this->super_QWidget);
  pQVar4 = QWidget::style(&this->super_QWidget);
  iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,5,(QStyleOptionFrame *)local_88,this);
  local_48._4_4_ = 1;
  local_48._0_4_ = iVar2;
  _local_78 = QRect::adjusted(rect,3,3,-3,-3);
  QPalette::operator=((QPalette *)auStack_60,pQVar3);
  local_88._8_4_ = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x5;
  pQVar4 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,0,(QStyleOptionFrame *)local_88,p,this);
  if ((this->curRow == row) && (this->curCol == col)) {
    bVar1 = QWidget::hasFocus(&this->super_QWidget);
    if (bVar1) {
      opt.backgroundColor._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.backgroundColor._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFocusRect::QStyleOptionFocusRect(&opt);
      QPalette::operator=(&opt.super_QStyleOption.palette,pQVar3);
      opt.super_QStyleOption.rect.x1.m_i = (rect->x1).m_i;
      opt.super_QStyleOption.rect.y1.m_i = (rect->y1).m_i;
      opt.super_QStyleOption.rect.x2.m_i = (rect->x2).m_i;
      opt.super_QStyleOption.rect.y2.m_i = (rect->y2).m_i;
      opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x800000
      ;
      pQVar4 = QWidget::style(&this->super_QWidget);
      (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,3,&opt,p,this);
      QStyleOption::~QStyleOption(&opt.super_QStyleOption);
    }
  }
  opt.super_QStyleOption.version = local_78._0_4_ + iVar2;
  opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(local_78._8_4_ - iVar2);
  opt.super_QStyleOption.type = local_78._4_4_ + iVar2;
  opt.super_QStyleOption.direction = RStack_6c.m_i - iVar2;
  (**(code **)(*(long *)&this->super_QWidget + 0x1b8))(this,p,row,col);
  QStyleOption::~QStyleOption((QStyleOption *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWellArray::paintCell(QPainter* p, int row, int col, const QRect &rect)
{
    int b = 3; //margin

    const QPalette & g = palette();
    QStyleOptionFrame opt;
    opt.initFrom(this);
    int dfw = style()->pixelMetric(QStyle::PM_DefaultFrameWidth, &opt, this);
    opt.lineWidth = dfw;
    opt.midLineWidth = 1;
    opt.rect = rect.adjusted(b, b, -b, -b);
    opt.palette = g;
    opt.state = QStyle::State_Enabled | QStyle::State_Sunken;
    style()->drawPrimitive(QStyle::PE_Frame, &opt, p, this);
    b += dfw;

    if ((row == curRow) && (col == curCol)) {
        if (hasFocus()) {
            QStyleOptionFocusRect opt;
            opt.palette = g;
            opt.rect = rect;
            opt.state = QStyle::State_None | QStyle::State_KeyboardFocusChange;
            style()->drawPrimitive(QStyle::PE_FrameFocusRect, &opt, p, this);
        }
    }
    paintCellContents(p, row, col, opt.rect.adjusted(dfw, dfw, -dfw, -dfw));
}